

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSObjectFactory.cpp
# Opt level: O1

XSParticle * __thiscall
xercesc_4_0::XSObjectFactory::createWildcardParticle
          (XSObjectFactory *this,ContentSpecNode *rootNode,XSModel *xsModel)

{
  int iVar1;
  XSWildcard *particleTerm;
  XSParticle *this_00;
  
  particleTerm = createXSWildcard(this,rootNode,xsModel);
  if (particleTerm == (XSWildcard *)0x0) {
    this_00 = (XSParticle *)0x0;
  }
  else {
    iVar1 = rootNode->fMaxOccurs;
    this_00 = (XSParticle *)XMemory::operator_new(0x50,this->fMemoryManager);
    XSParticle::XSParticle
              (this_00,TERM_WILDCARD,xsModel,&particleTerm->super_XSObject,
               (long)rootNode->fMinOccurs,(long)iVar1,(long)iVar1 == 0xffffffffffffffff,
               this->fMemoryManager);
  }
  return this_00;
}

Assistant:

XSParticle*
XSObjectFactory::createWildcardParticle(const ContentSpecNode* const rootNode,
                                        XSModel* const xsModel)
{
    XSWildcard* xsWildcard = createXSWildcard(rootNode, xsModel);
    if (xsWildcard)
    {
        int m = rootNode->getMaxOccurs();
        XSParticle* particle = new (fMemoryManager) XSParticle
        (
            XSParticle::TERM_WILDCARD
            , xsModel
            , xsWildcard
            , (XMLSize_t)rootNode->getMinOccurs()
            , (XMLSize_t)m
            , m == -1
            , fMemoryManager
        );

        return particle;
    }

    return 0;
}